

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O0

int __thiscall spv::Builder::getScalarTypeWidth(Builder *this,Id typeId)

{
  Id typeId_00;
  Op OVar1;
  uint uVar2;
  Instruction *this_00;
  bool bVar3;
  Id scalarTypeId;
  Id typeId_local;
  Builder *this_local;
  
  typeId_00 = getScalarTypeId(this,typeId);
  OVar1 = getTypeClass(this,typeId_00);
  bVar3 = true;
  if (OVar1 != OpTypeInt) {
    OVar1 = getTypeClass(this,typeId_00);
    bVar3 = OVar1 == OpTypeFloat;
  }
  if (!bVar3) {
    __assert_fail("getTypeClass(scalarTypeId) == OpTypeInt || getTypeClass(scalarTypeId) == OpTypeFloat"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.h"
                  ,0x159,"int spv::Builder::getScalarTypeWidth(Id) const");
  }
  this_00 = Module::getInstruction(&this->module,typeId_00);
  uVar2 = spv::Instruction::getImmediateOperand(this_00,0);
  return uVar2;
}

Assistant:

int getScalarTypeWidth(Id typeId) const
    {
        Id scalarTypeId = getScalarTypeId(typeId);
        assert(getTypeClass(scalarTypeId) == OpTypeInt || getTypeClass(scalarTypeId) == OpTypeFloat);
        return module.getInstruction(scalarTypeId)->getImmediateOperand(0);
    }